

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

timestamp_t __thiscall
duckdb::TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (OriginWidthConvertibleToMonthsTernaryOperator *this,interval_t bucket_width,
          timestamp_t ts,timestamp_t origin)

{
  bool bVar1;
  int32_t ts_months;
  int32_t origin_months;
  date_t input;
  timestamp_t tVar2;
  
  tVar2.value = bucket_width.micros;
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(tVar2);
  if (bVar1) {
    ts_months = EpochMonths<duckdb::timestamp_t>(tVar2);
    origin_months = EpochMonths<duckdb::timestamp_t>(ts);
    input = WidthConvertibleToMonthsCommon((int32_t)this,ts_months,origin_months);
    tVar2 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
    return (timestamp_t)tVar2.value;
  }
  tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar2);
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			int32_t origin_months = EpochMonths(origin);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, origin_months));
		}